

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibReader.cpp
# Opt level: O0

ssize_t __thiscall ZlibReader::read(ZlibReader *this,int __fd,void *__buf,size_t __nbytes)

{
  uInt uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  uLong uVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  size_t bytes_read;
  uInt z_avail_in_old;
  int zresult;
  size_t size_local;
  void *buf_local;
  ZlibReader *this_local;
  
  uVar6 = this->zpos;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->zbuf);
  if (uVar6 < sVar3) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->zbuf);
    uVar1 = (int)sVar3 - (int)this->zpos;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->zbuf,0);
    (this->z).next_in = pvVar4 + this->zpos;
    (this->z).avail_in = uVar1;
    (this->z).next_out = (Bytef *)CONCAT44(in_register_00000034,__fd);
    (this->z).avail_out = (uInt)__buf;
    iVar2 = inflate(&this->z,2);
    if ((iVar2 == 0) || (iVar2 == 1)) {
      this->zpos = (ulong)(uVar1 - (this->z).avail_in) + this->zpos;
      uVar6 = (long)__buf - (ulong)(this->z).avail_out;
      this->pos = uVar6 + this->pos;
      uVar5 = ::crc32(this->crc,(Bytef *)CONCAT44(in_register_00000034,__fd),uVar6 & 0xffffffff);
      this->crc = uVar5;
      this_local._4_4_ = (uint)uVar6;
    }
    else {
      this_local._4_4_ = 0xffffffff;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int ZlibReader::read(const void * buf, size_t size)
{
	int zresult;

	if (zpos >= zbuf.size())
	{
		return 0;
	}

	uInt z_avail_in_old = (uInt) (zbuf.size() - zpos);

	z.next_in = ((Bytef *) &zbuf[0]) + zpos;
	z.avail_in = z_avail_in_old;
	z.next_out = (Bytef *) buf;
	z.avail_out = (uInt) size;
	zresult = inflate(&z, Z_SYNC_FLUSH);
	if (zresult != Z_OK && zresult != Z_STREAM_END)
	{
		return -1;
	}

	zpos += (z_avail_in_old - z.avail_in);

	size_t bytes_read = (size - z.avail_out);
	pos += bytes_read;

	crc = ::crc32(crc, (const Bytef *) buf, (uInt) bytes_read);

	return (int) bytes_read;
}